

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

double stat_loadavg_one(void)

{
  double loadavg [3];
  double local_28 [4];
  
  getloadavg(local_28,3);
  return local_28[0];
}

Assistant:

double stat_loadavg_one ( void )
{
  double val;
#ifdef HAVE_GETLOADAVG
  double loadavg[3];
  getloadavg(loadavg,3);
  val = loadavg[0];
  
#else      
  sensor_slurp proc_loadavg = { "/proc/loadavg" };
  val = strtod( update_file(&proc_loadavg), (char **)NULL);
#endif //end HAVE_GETLOADAVG
    return val;
}